

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tang_join_ti_impl.h
# Opt level: O1

bool __thiscall
join::
TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::recursive_partitionable
          (TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
           *this,BinaryNode<label::StringLabel> *curr_node,int delta,int gamma,
          int *nr_of_subgraphs_found)

{
  _Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false> curr_node_00;
  BinaryNode<label::StringLabel> *curr_node_01;
  bool bVar1;
  
  curr_node->subgraph_size_ = 1;
  curr_node->detached_ = 0;
  curr_node_00._M_head_impl =
       (curr_node->left_child_)._M_t.
       super___uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
       .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl;
  curr_node_01 = (curr_node->right_child_)._M_t.
                 super___uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
                 .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl;
  if (curr_node_00._M_head_impl != (BinaryNode<label::StringLabel> *)0x0) {
    bVar1 = recursive_partitionable
                      (this,curr_node_00._M_head_impl,delta,gamma,nr_of_subgraphs_found);
    if (bVar1) {
      return true;
    }
    curr_node->subgraph_size_ =
         curr_node->subgraph_size_ + (curr_node_00._M_head_impl)->subgraph_size_;
    curr_node->detached_ = curr_node->detached_ + (curr_node_00._M_head_impl)->detached_;
  }
  if (curr_node_01 != (BinaryNode<label::StringLabel> *)0x0) {
    bVar1 = recursive_partitionable(this,curr_node_01,delta,gamma,nr_of_subgraphs_found);
    if (bVar1) {
      return true;
    }
    curr_node->subgraph_size_ = curr_node->subgraph_size_ + curr_node_01->subgraph_size_;
    curr_node->detached_ = curr_node->detached_ + curr_node_01->detached_;
  }
  if (gamma <= curr_node->subgraph_size_ - curr_node->detached_) {
    *nr_of_subgraphs_found = *nr_of_subgraphs_found + 1;
    curr_node->detached_ = curr_node->subgraph_size_;
    if (delta <= *nr_of_subgraphs_found) {
      return true;
    }
  }
  return false;
}

Assistant:

bool TangJoinTI<Label, VerificationAlgorithm>::recursive_partitionable(
    node::BinaryNode<Label>* curr_node, int delta, int gamma, 
    int& nr_of_subgraphs_found) {
  
  curr_node->set_subgraph_size(1);
  curr_node->set_detached(0);

  node::BinaryNode<Label>* left_child = curr_node->get_left_child();
  node::BinaryNode<Label>* right_child = curr_node->get_right_child();
  if(left_child != nullptr) {
    if(recursive_partitionable(left_child, delta, gamma, nr_of_subgraphs_found))
      return true;
    curr_node->set_subgraph_size(curr_node->get_subgraph_size() + left_child->get_subgraph_size());
    curr_node->set_detached(curr_node->get_detached() + left_child->get_detached());
  }
  if(right_child != nullptr) {
    if(recursive_partitionable(right_child, delta, gamma, nr_of_subgraphs_found))
      return true;
    curr_node->set_subgraph_size(curr_node->get_subgraph_size() + right_child->get_subgraph_size());
    curr_node->set_detached(curr_node->get_detached() + right_child->get_detached());
  }
  if(curr_node->get_subgraph_size() - curr_node->get_detached() >= gamma) {
    ++nr_of_subgraphs_found;  // identified gamma subtree
    curr_node->set_detached(curr_node->get_subgraph_size());
    if(nr_of_subgraphs_found >= delta)
      return true;  // found (delta, gamma)-partitioning
  }

  return false;
}